

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void tlbiasid_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  CPUState *cpu;
  _Bool _Var1;
  
  cpu = (CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14);
  _Var1 = tlb_force_broadcast(env);
  if (_Var1) {
    tlb_flush_all_cpus_synced_aarch64(cpu);
    return;
  }
  tlb_flush_aarch64(cpu);
  return;
}

Assistant:

static void tlbiasid_write(CPUARMState *env, const ARMCPRegInfo *ri,
                           uint64_t value)
{
    /* Invalidate by ASID (TLBIASID) */
    CPUState *cs = env_cpu(env);

    if (tlb_force_broadcast(env)) {
        tlb_flush_all_cpus_synced(cs);
    } else {
        tlb_flush(cs);
    }
}